

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O2

void CatcherComposition_Tests::Catch_internal_CatcherComposition_with_custom_action_works_invoker
               (void)

{
  unit_test_log_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  const_string local_258;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  const_string local_218;
  basic_wrap_stringstream<char> local_208;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  const_string local_30;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_218.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Catch_internal_CatcherComposition_with_custom_action_works"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_30.m_end = local_30.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_218,0x70,&local_30);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_228.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Catch_internal_CatcherComposition_with_custom_action_works"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_40.m_end = local_40.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_228,0x70,&local_40);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_238.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Catch_internal_CatcherComposition_with_custom_action_works"
                 );
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_50.m_end = local_50.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_238,0x70,&local_50);
  this = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  Catch_internal_CatcherComposition_with_custom_action_works::test_method
            ((Catch_internal_CatcherComposition_with_custom_action_works *)this);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_248.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Catch_internal_CatcherComposition_with_custom_action_works"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_60.m_end = local_60.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_248,0x70,&local_60);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_258.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"Catch_internal_CatcherComposition_with_custom_action_works"
                 );
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_70.m_end = local_70.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_258,0x70,&local_70);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Catch_internal_CatcherComposition_with_custom_action_works)
{
   int hit=0;
   for (int i=0; i<3; ++i)
   {
      try
      {
         switch(i)
         {
         case 0: throw_bad_alloc();
         case 1: throw_std_exception();
         case 2: throw_int();
         }
      }
      catch (...)
      {
         auto catcher = all_catcher(             2, [&hit](){ ++hit; }, 
                           std_exception_handler(1, [&hit](std::exception&){ ++hit; }, 
                              bad_alloc_handler( 0, [&hit](std::bad_alloc&){ ++hit; }, 
                                 UnHandler<>()))); 

         BOOST_CHECK_EQUAL(i,hit);
         BOOST_CHECK_EQUAL(i, catcher.handleException());
         BOOST_CHECK_EQUAL(i+1,hit);
      }
   }
}